

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roialign.cpp
# Opt level: O3

int __thiscall
ncnn::ROIAlign::forward
          (ROIAlign *this,vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *bottom_blobs,
          vector<ncnn::Mat,_std::allocator<ncnn::Mat>_> *top_blobs,Option *opt)

{
  ulong uVar1;
  undefined8 uVar2;
  undefined8 uVar3;
  ulong uVar4;
  int iVar5;
  int iVar6;
  uint _c;
  pointer pMVar7;
  Mat *this_00;
  void *pvVar8;
  size_t sVar9;
  void *pvVar10;
  size_t sVar11;
  size_t sVar12;
  size_t sVar13;
  undefined1 auVar14 [16];
  undefined1 auVar15 [16];
  int iVar16;
  int iVar17;
  int iVar18;
  ulong uVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  int iVar23;
  undefined4 uVar24;
  int iVar25;
  uint uVar26;
  int iVar27;
  long lVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  int iVar32;
  float fVar33;
  float fVar34;
  float fVar35;
  float fVar36;
  float fVar37;
  float fVar38;
  float fVar39;
  float fVar40;
  float fVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  float fVar45;
  float __x;
  undefined1 auVar46 [16];
  float fVar47;
  int local_150;
  void *local_148;
  void *local_138;
  ulong local_130;
  ulong local_f0;
  ulong local_c8;
  Allocator *_allocator;
  
  pMVar7 = (bottom_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
           super__Vector_impl_data._M_start;
  iVar5 = pMVar7->w;
  iVar6 = pMVar7->h;
  _c = pMVar7->c;
  this_00 = (top_blobs->super__Vector_base<ncnn::Mat,_std::allocator<ncnn::Mat>_>)._M_impl.
            super__Vector_impl_data._M_start;
  _allocator = opt->blob_allocator;
  Mat::create(this_00,this->pooled_width,this->pooled_height,_c,pMVar7->elemsize,_allocator);
  uVar24 = SUB84(_allocator,0);
  pvVar8 = this_00->data;
  iVar21 = -100;
  if ((pvVar8 != (void *)0x0) && (sVar9 = this_00->cstep, (long)this_00->c * sVar9 != 0)) {
    fVar45 = this->spatial_scale;
    uVar2 = *pMVar7[1].data;
    uVar3 = *(undefined8 *)((long)pMVar7[1].data + 8);
    fVar36 = (float)uVar2 * fVar45;
    fVar38 = (float)((ulong)uVar2 >> 0x20) * fVar45;
    auVar46._0_4_ = (float)uVar3 * fVar45 - fVar36;
    auVar46._4_4_ = (float)((ulong)uVar3 >> 0x20) * fVar45 - fVar38;
    auVar46._8_4_ = fVar45 * 0.0 - fVar45 * 0.0;
    auVar46._12_4_ = fVar45 * 0.0 - fVar45 * 0.0;
    if (this->aligned == true) {
      fVar36 = fVar36 + -0.5;
      fVar38 = fVar38 + -0.5;
    }
    else {
      auVar46 = maxps(auVar46,_DAT_005a6660);
    }
    uVar4._0_4_ = this->pooled_width;
    uVar4._4_4_ = this->pooled_height;
    auVar14._4_4_ = (float)(int)uVar4._4_4_;
    auVar14._0_4_ = (float)(int)(undefined4)uVar4;
    auVar14._8_8_ = 0;
    auVar46 = divps(auVar46,auVar14);
    fVar45 = auVar46._0_4_;
    __x = auVar46._4_4_;
    if (this->version == 1) {
      if (this->sampling_ratio < 1) {
        fVar47 = ceilf(fVar45);
        fVar33 = ceilf(__x);
      }
      else {
        fVar47 = (float)this->sampling_ratio;
        fVar33 = fVar47;
      }
      if ((int)_c < 1) {
        return 0;
      }
      iVar32 = (int)fVar47;
      iVar16 = (int)fVar33;
      iVar21 = 1;
      if (1 < iVar32 * iVar16) {
        iVar21 = iVar32 * iVar16;
      }
      pvVar10 = pMVar7->data;
      sVar11 = pMVar7->cstep;
      sVar12 = pMVar7->elemsize;
      sVar13 = this_00->elemsize;
      auVar15._4_4_ = -(uint)(0 < iVar32);
      auVar15._0_4_ = -(uint)(0 < iVar32);
      auVar15._8_4_ = -(uint)(0 < iVar16);
      auVar15._12_4_ = -(uint)(0 < iVar16);
      uVar26 = movmskpd(uVar24,auVar15);
      local_c8 = 0;
      do {
        if (0 < (int)uVar4._4_4_) {
          lVar28 = sVar11 * sVar12 * local_c8;
          local_148 = (void *)(sVar9 * sVar13 * local_c8 + (long)pvVar8);
          local_150 = 0;
          do {
            if (0 < (int)(undefined4)uVar4) {
              local_130 = 0;
              do {
                fVar33 = 0.0;
                if ((byte)((byte)uVar26 >> 1) != 0) {
                  iVar17 = 0;
                  do {
                    if ((uVar26 & 1) != 0) {
                      fVar47 = ((float)iVar17 + 0.5) * __x * (1.0 / (float)iVar16) +
                               (float)local_150 * __x + fVar38;
                      iVar22 = 0;
                      do {
                        if ((((-1.0 <= fVar47) && (fVar47 <= (float)iVar6)) &&
                            (fVar29 = ((float)iVar22 + 0.5) * fVar45 * (1.0 / (float)iVar32) +
                                      (float)(int)local_130 * fVar45 + fVar36, -1.0 <= fVar29)) &&
                           (fVar29 <= (float)iVar5)) {
                          fVar35 = 0.0;
                          if (fVar47 <= 0.0) {
                            fVar47 = 0.0;
                          }
                          if (fVar29 <= 0.0) {
                            fVar29 = 0.0;
                          }
                          iVar27 = (int)fVar29;
                          iVar25 = iVar27 + 1;
                          iVar23 = (int)fVar47 + 1;
                          if (iVar25 < iVar5) {
                            fVar34 = fVar29 - (float)(int)fVar29;
                            if (iVar25 < iVar5) goto LAB_0044db24;
LAB_0044db44:
                            fVar29 = 1.0;
                          }
                          else {
                            fVar34 = 0.0;
                            if (iVar5 <= iVar25) goto LAB_0044db44;
LAB_0044db24:
                            fVar29 = (float)iVar25 - fVar29;
                          }
                          if (iVar5 <= iVar25) {
                            iVar25 = iVar5 + -1;
                          }
                          if (iVar23 < iVar6) {
                            fVar30 = (float)iVar23 - fVar47;
                            fVar35 = fVar47 - (float)(int)fVar47;
                          }
                          else {
                            fVar30 = 1.0;
                            iVar23 = iVar6 + -1;
                          }
                          iVar18 = (int)fVar47 * iVar5;
                          fVar33 = (*(float *)((long)pvVar10 + (long)(iVar18 + iVar25) * 4 + lVar28)
                                    * fVar34 +
                                   *(float *)((long)pvVar10 + (long)(iVar18 + iVar27) * 4 + lVar28)
                                   * fVar29) * fVar30 + fVar33 +
                                   (fVar34 * *(float *)((long)pvVar10 +
                                                       (long)(iVar23 * iVar5 + iVar25) * 4 + lVar28)
                                   + fVar29 * *(float *)((long)pvVar10 +
                                                        (long)(iVar27 + iVar23 * iVar5) * 4 + lVar28
                                                        )) * fVar35;
                        }
                        iVar22 = iVar22 + 1;
                      } while (iVar32 != iVar22);
                    }
                    iVar17 = iVar17 + 1;
                  } while (iVar17 != iVar16);
                }
                *(float *)((long)local_148 + local_130 * 4) = fVar33 * (1.0 / (float)iVar21);
                local_130 = local_130 + 1;
              } while (local_130 != (uVar4 & 0xffffffff));
            }
            local_148 = (void *)((long)local_148 + (long)(int)(undefined4)uVar4 * 4);
            local_150 = local_150 + 1;
          } while (local_150 != uVar4._4_4_);
        }
        local_c8 = local_c8 + 1;
      } while (local_c8 != _c);
    }
    else {
      if (this->version != 0) {
        return 0;
      }
      if ((int)_c < 1) {
        return 0;
      }
      pvVar10 = pMVar7->data;
      sVar11 = pMVar7->cstep;
      sVar12 = pMVar7->elemsize;
      sVar13 = this_00->elemsize;
      fVar33 = (float)iVar6;
      fVar47 = (float)iVar5;
      local_f0 = 0;
      do {
        if (0 < (int)uVar4._4_4_) {
          lVar28 = sVar11 * sVar12 * local_f0;
          local_138 = (void *)(sVar9 * sVar13 * local_f0 + (long)pvVar8);
          iVar21 = this->sampling_ratio;
          fVar29 = (float)iVar21;
          iVar32 = 0;
          do {
            if (0 < (int)(undefined4)uVar4) {
              fVar34 = (float)iVar32 * __x + fVar38;
              fVar35 = (float)(iVar32 + 1) * __x + fVar38;
              if (fVar34 <= 0.0) {
                fVar34 = 0.0;
              }
              if (fVar33 <= fVar34) {
                fVar34 = fVar33;
              }
              if (fVar35 <= 0.0) {
                fVar35 = 0.0;
              }
              if (fVar33 <= fVar35) {
                fVar35 = fVar33;
              }
              fVar30 = ceilf(fVar35 - fVar34);
              uVar19 = 0;
              do {
                uVar1 = uVar19 + 1;
                fVar44 = (float)(int)uVar19 * fVar45 + fVar36;
                fVar37 = (float)(int)uVar1 * fVar45 + fVar36;
                if (fVar44 <= 0.0) {
                  fVar44 = 0.0;
                }
                if (fVar47 <= fVar44) {
                  fVar44 = fVar47;
                }
                if (fVar37 <= 0.0) {
                  fVar37 = 0.0;
                }
                if (fVar47 <= fVar37) {
                  fVar37 = fVar47;
                }
                fVar31 = fVar29;
                fVar42 = fVar29;
                if (iVar21 < 1) {
                  fVar31 = ceilf(fVar37 - fVar44);
                  fVar42 = fVar30;
                }
                iVar16 = (int)fVar42;
                iVar17 = (int)fVar31;
                fVar31 = 0.0;
                fVar42 = 0.0;
                if (0 < iVar16) {
                  fVar42 = 0.0;
                  iVar22 = 0;
                  do {
                    if (0 < iVar17) {
                      fVar39 = ((float)iVar22 + 0.5) * __x * (1.0 / (float)iVar16) + fVar34;
                      iVar25 = (int)fVar39 + 1;
                      if (iVar25 < iVar6) {
                        fVar41 = (float)iVar25 - fVar39;
                        if (iVar25 < iVar6) goto LAB_0044d6e9;
LAB_0044d70c:
                        fVar40 = 0.0;
                      }
                      else {
                        fVar41 = 1.0;
                        if (iVar6 <= iVar25) goto LAB_0044d70c;
LAB_0044d6e9:
                        fVar40 = fVar39 - (float)(int)fVar39;
                      }
                      if (iVar6 <= iVar25) {
                        iVar25 = iVar6 + -1;
                      }
                      iVar23 = (int)fVar39 * iVar5;
                      iVar27 = 0;
                      do {
                        fVar39 = ((float)iVar27 + 0.5) * fVar45 * (1.0 / (float)iVar17) + fVar44;
                        iVar20 = (int)fVar39;
                        iVar18 = iVar20 + 1;
                        if (iVar18 < iVar5) {
                          fVar43 = fVar39 - (float)(int)fVar39;
                          if (iVar5 <= iVar18) goto LAB_0044d752;
LAB_0044d76a:
                          fVar39 = (float)iVar18 - fVar39;
                        }
                        else {
                          fVar43 = 0.0;
                          if (iVar18 < iVar5) goto LAB_0044d76a;
LAB_0044d752:
                          fVar39 = 1.0;
                        }
                        if (iVar5 <= iVar18) {
                          iVar18 = iVar5 + -1;
                        }
                        fVar42 = (fVar43 * *(float *)((long)pvVar10 +
                                                     (long)(iVar18 + iVar25 * iVar5) * 4 + lVar28) +
                                 fVar39 * *(float *)((long)pvVar10 +
                                                    (long)(iVar20 + iVar25 * iVar5) * 4 + lVar28)) *
                                 fVar40 + fVar42 + (*(float *)((long)pvVar10 +
                                                              (long)(iVar18 + iVar23) * 4 + lVar28)
                                                    * fVar43 +
                                                   *(float *)((long)pvVar10 +
                                                             (long)(iVar23 + iVar20) * 4 + lVar28) *
                                                   fVar39) * fVar41;
                        iVar27 = iVar27 + 1;
                      } while (iVar17 != iVar27);
                    }
                    iVar22 = iVar22 + 1;
                  } while (iVar22 != iVar16);
                }
                if (fVar34 < fVar35 && fVar44 < fVar37) {
                  fVar31 = fVar42 / (float)(iVar17 * iVar16);
                }
                *(float *)((long)local_138 + uVar19 * 4) = fVar31;
                uVar19 = uVar1;
              } while (uVar1 != (uVar4 & 0xffffffff));
            }
            iVar32 = iVar32 + 1;
            local_138 = (void *)((long)local_138 + (long)(int)(undefined4)uVar4 * 4);
          } while (iVar32 != uVar4._4_4_);
        }
        local_f0 = local_f0 + 1;
      } while (local_f0 != _c);
    }
    iVar21 = 0;
  }
  return iVar21;
}

Assistant:

int ROIAlign::forward(const std::vector<Mat>& bottom_blobs, std::vector<Mat>& top_blobs, const Option& opt) const
{
    const Mat& bottom_blob = bottom_blobs[0];
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    size_t elemsize = bottom_blob.elemsize;
    int channels = bottom_blob.c;

    const Mat& roi_blob = bottom_blobs[1];

    Mat& top_blob = top_blobs[0];
    top_blob.create(pooled_width, pooled_height, channels, elemsize, opt.blob_allocator);
    if (top_blob.empty())
        return -100;

    // For each ROI R = [x y w h]: avg pool over R
    const float* roi_ptr = roi_blob;

    float roi_x1 = roi_ptr[0] * spatial_scale;
    float roi_y1 = roi_ptr[1] * spatial_scale;
    float roi_x2 = roi_ptr[2] * spatial_scale;
    float roi_y2 = roi_ptr[3] * spatial_scale;
    if (aligned)
    {
        roi_x1 -= 0.5f;
        roi_y1 -= 0.5f;
        roi_x2 -= 0.5f;
        roi_y2 -= 0.5f;
    }

    float roi_w = roi_x2 - roi_x1;
    float roi_h = roi_y2 - roi_y1;

    if (!aligned)
    {
        roi_w = std::max(roi_w, 1.f);
        roi_h = std::max(roi_h, 1.f);
    }

    float bin_size_w = roi_w / (float)pooled_width;
    float bin_size_h = roi_h / (float)pooled_height;

    if (version == 0)
    {
        // original version
        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    // Compute pooling region for this output unit:
                    //  start (included) = ph * roi_height / pooled_height
                    //  end (excluded) = (ph + 1) * roi_height / pooled_height
                    float hstart = roi_y1 + ph * bin_size_h;
                    float wstart = roi_x1 + pw * bin_size_w;
                    float hend = roi_y1 + (ph + 1) * bin_size_h;
                    float wend = roi_x1 + (pw + 1) * bin_size_w;

                    hstart = std::min(std::max(hstart, 0.f), (float)h);
                    wstart = std::min(std::max(wstart, 0.f), (float)w);
                    hend = std::min(std::max(hend, 0.f), (float)h);
                    wend = std::min(std::max(wend, 0.f), (float)w);

                    int bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(hend - hstart));
                    int bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(wend - wstart));

                    bool is_empty = (hend <= hstart) || (wend <= wstart);
                    int area = bin_grid_h * bin_grid_w;

                    float sum = 0.f;
                    for (int by = 0; by < bin_grid_h; by++)
                    {
                        float y = hstart + (by + 0.5f) * bin_size_h / (float)bin_grid_h;

                        for (int bx = 0; bx < bin_grid_w; bx++)
                        {
                            float x = wstart + (bx + 0.5f) * bin_size_w / (float)bin_grid_w;

                            // bilinear interpolate at (x,y)
                            float v = bilinear_interpolate(ptr, w, h, x, y);

                            sum += v;
                        }
                    }

                    outptr[pw] = is_empty ? 0.f : (sum / (float)area);
                }

                outptr += pooled_width;
            }
        }
    }
    else if (version == 1)
    {
        // the version in detectron 2
        int roi_bin_grid_h = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_h / pooled_height));
        int roi_bin_grid_w = (int)(sampling_ratio > 0 ? sampling_ratio : ceil(roi_w / pooled_width));

        const float count = (float)std::max(roi_bin_grid_h * roi_bin_grid_w, 1);

        #pragma omp parallel for num_threads(opt.num_threads)
        for (int q = 0; q < channels; q++)
        {
            const float* ptr = bottom_blob.channel(q);
            float* outptr = top_blob.channel(q);

            for (int ph = 0; ph < pooled_height; ph++)
            {
                for (int pw = 0; pw < pooled_width; pw++)
                {
                    float sum = 0.f;
                    for (int by = 0; by < roi_bin_grid_h; by++)
                    {
                        float y = roi_y1 + ph * bin_size_h + (by + 0.5f) * bin_size_h / (float)roi_bin_grid_h;

                        for (int bx = 0; bx < roi_bin_grid_w; bx++)
                        {
                            float x = roi_x1 + pw * bin_size_w + (bx + 0.5f) * bin_size_w / (float)roi_bin_grid_w;

                            if (y < -1.0 || y > h || x < -1.0 || x > w)
                            {
                                // empty
                                continue;
                            }
                            else
                            {
                                if (y <= 0) y = 0;
                                if (x <= 0) x = 0;

                                // bilinear interpolate at (x,y)
                                float v = bilinear_interpolate(ptr, w, h, x, y);
                                sum += v;
                            }
                        }
                    }
                    outptr[pw] = sum / count;
                }

                outptr += pooled_width;
            }
        }
    }

    return 0;
}